

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

int __thiscall wallet::CWallet::GetTxBlocksToMaturity(CWallet *this,CWalletTx *wtx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CTransaction::IsCoinBase
                    ((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (bVar2) {
    iVar3 = GetTxDepthInMainChain(this,wtx);
    if (iVar3 < 0) {
      __assert_fail("chain_depth >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xd85,"int wallet::CWallet::GetTxBlocksToMaturity(const CWalletTx &) const");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00169da2:
      __stack_chk_fail();
    }
    iVar4 = 0;
    if (0 < 0x65 - iVar3) {
      iVar4 = 0x65 - iVar3;
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00169da2;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int CWallet::GetTxBlocksToMaturity(const CWalletTx& wtx) const
{
    AssertLockHeld(cs_wallet);

    if (!wtx.IsCoinBase()) {
        return 0;
    }
    int chain_depth = GetTxDepthInMainChain(wtx);
    assert(chain_depth >= 0); // coinbase tx should not be conflicted
    return std::max(0, (COINBASE_MATURITY+1) - chain_depth);
}